

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pager_playback(Pager *pPager,int isHot)

{
  sqlite3_vfs *psVar1;
  u64 n;
  u32 uVar2;
  sqlite3_file *pJrnl;
  int iVar3;
  int iVar4;
  int iVar5;
  sqlite3_file *__s;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  bool bVar9;
  char *pcVar10;
  uint uVar11;
  bool bVar12;
  u32 nRec;
  int res;
  Pgno mxPg;
  i64 szJ;
  i64 nMasterJournal;
  u32 savedPageSize;
  u32 local_84;
  char *local_80;
  char *local_78;
  sqlite3_vfs *local_70;
  int local_68;
  u32 local_64;
  i64 local_60;
  char *local_58;
  u32 local_50;
  int local_4c;
  char *local_48;
  long local_40;
  sqlite3_file *local_38;
  
  psVar1 = pPager->pVfs;
  local_64 = 0;
  local_68 = 1;
  local_50 = pPager->pageSize;
  iVar3 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,&local_60);
  uVar11 = 0;
  if (iVar3 == 0) {
    pcVar10 = pPager->pTmpSpace;
    iVar3 = readMasterJournal(pPager->jfd,pcVar10,pPager->pVfs->mxPathname + 1);
    if (iVar3 == 0) {
      if (*pcVar10 == '\0') {
        iVar3 = 0;
      }
      else {
        iVar3 = (*psVar1->xAccess)(psVar1,pcVar10,0,&local_68);
      }
    }
    uVar11 = 0;
    if ((iVar3 == 0) && (uVar11 = 0, local_68 != 0)) {
      pPager->journalOff = 0;
      iVar5 = readJournalHdr(pPager,isHot,local_60,&local_84,&local_64);
      if (iVar5 == 0) {
        uVar11 = 0;
        iVar4 = isHot;
        do {
          uVar2 = local_64;
          if (local_84 == 0xffffffff) {
            local_84 = (u32)((long)(local_60 - (ulong)pPager->sectorSize) /
                            ((long)pPager->pageSize + 8));
          }
          if ((local_84 == 0 && isHot == 0) &&
             ((ulong)pPager->sectorSize + pPager->journalHdr == pPager->journalOff)) {
            local_84 = (u32)((local_60 - pPager->journalOff) / ((long)pPager->pageSize + 8));
          }
          if (pPager->journalOff == (ulong)pPager->sectorSize) {
            iVar3 = pager_truncate(pPager,local_64);
            if (iVar3 != 0) goto LAB_00138f25;
            pPager->dbSize = uVar2;
          }
          if (local_84 != 0) {
            local_70 = (sqlite3_vfs *)CONCAT44(local_70._4_4_,uVar11 + local_84);
            bVar12 = iVar4 == 0;
            iVar3 = -local_84;
            iVar5 = 0;
            do {
              if (!bVar12) {
                pager_reset(pPager);
              }
              iVar4 = pager_playback_one_page(pPager,&pPager->journalOff,(Bitvec *)0x0,1,0);
              if (iVar4 != 0) {
                if (iVar4 == 0x65) {
                  pPager->journalOff = local_60;
                  iVar4 = 0;
                  uVar11 = uVar11 - iVar5;
                  goto LAB_00139256;
                }
                iVar3 = 0;
                if (iVar4 != 0x20a) {
                  iVar3 = iVar4;
                }
                uVar11 = uVar11 - iVar5;
                goto LAB_00138f25;
              }
              iVar5 = iVar5 + -1;
              bVar12 = true;
            } while (iVar3 != iVar5);
            iVar4 = 0;
            uVar11 = (uint)local_70;
          }
LAB_00139256:
          iVar5 = readJournalHdr(pPager,isHot,local_60,&local_84,&local_64);
        } while (iVar5 == 0);
      }
      else {
        uVar11 = 0;
      }
      iVar3 = 0;
      if (iVar5 != 0x65) {
        iVar3 = iVar5;
      }
    }
  }
LAB_00138f25:
  if (iVar3 == 0) {
    iVar3 = sqlite3PagerSetPagesize(pPager,&local_50,-1);
  }
  pPager->changeCountDone = pPager->tempFile;
  if (iVar3 == 0) {
    pcVar10 = pPager->pTmpSpace;
    iVar3 = readMasterJournal(pPager->jfd,pcVar10,pPager->pVfs->mxPathname + 1);
  }
  else {
    pcVar10 = (char *)0x0;
  }
  if ((iVar3 == 0) && (iVar3 = 0, (byte)(pPager->eState - 4) < 0xfd)) {
    iVar3 = sqlite3PagerSync(pPager,(char *)0x0);
  }
  if (iVar3 == 0) {
    iVar3 = pager_end_transaction(pPager,(uint)(*pcVar10 != '\0'),0);
  }
  if (((iVar3 != 0) || (iVar3 = 0, *pcVar10 == '\0')) || (local_68 == 0)) goto LAB_00138ff8;
  local_70 = pPager->pVfs;
  n = (long)local_70->szOsFile * 2;
  __s = (sqlite3_file *)sqlite3Malloc(n);
  if (__s != (sqlite3_file *)0x0) {
    memset(__s,0,n);
  }
  local_38 = (sqlite3_file *)(long)local_70->szOsFile;
  if (__s == (sqlite3_file *)0x0) {
    iVar3 = 7;
  }
  else {
    iVar3 = (*local_70->xOpen)(local_70,pcVar10,__s,0x4001,(int *)0x0);
  }
  if ((iVar3 == 0) &&
     (iVar3 = (*__s->pMethods->xFileSize)(__s,(sqlite3_int64 *)&local_58), iVar3 == 0)) {
    iVar3 = local_70->mxPathname;
    pcVar6 = (char *)sqlite3Malloc((u64)(local_58 + (long)iVar3 + 2));
    if (pcVar6 == (char *)0x0) {
      iVar3 = 7;
      goto LAB_001390c3;
    }
    local_78 = local_58;
    local_80 = pcVar6;
    local_40 = (long)iVar3;
    iVar3 = (*__s->pMethods->xRead)(__s,pcVar6,(int)local_58,0);
    pcVar6 = local_80;
    if (iVar3 == 0) {
      local_38 = (sqlite3_file *)((long)&__s->pMethods + (long)&local_38->pMethods);
      local_40 = local_40 + 1;
      local_48 = local_78 + (long)local_80 + 1;
      local_80[(long)local_58] = '\0';
      do {
        psVar1 = local_70;
        if ((long)local_58 <= (long)pcVar6 - (long)local_80) {
          if (__s->pMethods != (sqlite3_io_methods *)0x0) {
            (*__s->pMethods->xClose)(__s);
            __s->pMethods = (sqlite3_io_methods *)0x0;
          }
          iVar3 = (*psVar1->xDelete)(psVar1,pcVar10,0);
          pcVar6 = local_80;
          goto LAB_001390c5;
        }
        local_78 = pcVar6;
        iVar3 = (*local_70->xAccess)(local_70,pcVar6,0,&local_4c);
        pJrnl = local_38;
        if (iVar3 == 0) {
          if (local_4c == 0) {
            iVar3 = 0;
          }
          else {
            iVar3 = (*local_70->xOpen)(local_70,local_78,local_38,0x801,(int *)0x0);
            bVar12 = true;
            if (iVar3 == 0) {
              iVar3 = readMasterJournal(pJrnl,local_48,(u32)local_40);
              if (pJrnl->pMethods != (sqlite3_io_methods *)0x0) {
                (*pJrnl->pMethods->xClose)(pJrnl);
                pJrnl->pMethods = (sqlite3_io_methods *)0x0;
              }
              if (iVar3 == 0) {
                iVar3 = 0;
                if (*local_48 == '\0') {
                  bVar12 = false;
                }
                else {
                  iVar5 = strcmp(local_48,pcVar10);
                  bVar12 = iVar5 == 0;
                }
                bVar9 = (bool)(bVar12 ^ 1);
              }
              else {
                bVar9 = false;
                bVar12 = true;
              }
            }
            else {
              bVar9 = false;
            }
            pcVar6 = local_78;
            if (!bVar9) goto LAB_00139458;
          }
          if (local_78 == (char *)0x0) {
            lVar8 = 1;
          }
          else {
            sVar7 = strlen(local_78);
            lVar8 = (ulong)((uint)sVar7 & 0x3fffffff) + 1;
          }
          pcVar6 = local_78 + lVar8;
          bVar12 = false;
        }
        else {
          bVar12 = true;
          pcVar6 = local_78;
        }
LAB_00139458:
      } while (!bVar12);
      pcVar6 = local_80;
      if (!bVar12) goto LAB_00138ff8;
    }
  }
  else {
LAB_001390c3:
    pcVar6 = (char *)0x0;
  }
LAB_001390c5:
  sqlite3_free(pcVar6);
  if (__s != (sqlite3_file *)0x0) {
    if (__s->pMethods != (sqlite3_io_methods *)0x0) {
      (*__s->pMethods->xClose)(__s);
      __s->pMethods = (sqlite3_io_methods *)0x0;
    }
    sqlite3_free(__s);
  }
LAB_00138ff8:
  if ((isHot != 0) && (uVar11 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",(ulong)uVar11,pPager->zJournal);
  }
  setSectorSize(pPager);
  return iVar3;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zMaster = 0;       /* Name of master journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */
  u32 savedPageSize = pPager->pageSize;

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the master journal name from the journal, if it is present.
  ** If a master journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  ** mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zMaster = pPager->pTmpSpace;
  rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zMaster[0] ){
    rc = sqlite3OsAccess(pVfs, zMaster, SQLITE_ACCESS_EXISTS, &res);
  }
  zMaster = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or 
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error 
  ** occurs. 
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){ 
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages 
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
    }

    /* Copy original pages out of the journal and back into the 
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  if( rc==SQLITE_OK ){
    rc = sqlite3PagerSetPagesize(pPager, &savedPageSize, -1);
  }
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
#endif

  /* If this playback is happening automatically as a result of an IO or 
  ** malloc error that occurred after the change-counter was updated but 
  ** before the transaction was committed, then the change-counter 
  ** modification may just have been reverted. If this happens in exclusive 
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    zMaster = pPager->pTmpSpace;
    rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zMaster[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zMaster[0] && res ){
    /* If there was a master journal and this routine will return success,
    ** see if it is possible to delete the master journal.
    */
    rc = pager_delmaster(pPager, zMaster);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}